

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

saucy_graph *
buildSim2Graph(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randVec,Vec_Int_t **iDep,Vec_Int_t **oDep,
              Vec_Ptr_t **topOrder,Vec_Int_t **obs,Vec_Int_t **ctrl)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *p;
  int iVar3;
  int iVar4;
  int iVar5;
  int *pModel;
  int *__ptr;
  ulong uVar6;
  int *piVar7;
  saucy_graph *psVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  
  uVar1 = pNtk->vPos->nSize;
  uVar2 = pNtk->vPis->nSize;
  pModel = generateProperInputVector(pNtk,c,randVec);
  if (pModel == (int *)0x0) {
    psVar8 = (saucy_graph *)0x0;
  }
  else {
    iVar5 = 0;
    __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
    uVar6 = 0;
    if (0 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
      if (c->clen[c->cfront[uVar12 + (long)(int)uVar1]] != 0) {
        pModel[uVar12] = (uint)(pModel[uVar12] == 0);
        piVar7 = Abc_NtkSimulateOneNode(pNtk,pModel,(int)uVar12,(Vec_Ptr_t **)oDep);
        for (iVar10 = 0; iVar10 < iDep[uVar12]->nSize; iVar10 = iVar10 + 1) {
          iVar3 = Vec_IntEntry(iDep[uVar12],iVar10);
          iVar3 = __ptr[iVar3];
          iVar4 = Vec_IntEntry(iDep[uVar12],iVar10);
          if (iVar3 != piVar7[iVar4]) {
            p = topOrder[uVar12];
            iVar3 = Vec_IntEntry(iDep[uVar12],iVar10);
            Vec_IntPush((Vec_Int_t *)p,iVar3);
            iVar3 = Vec_IntEntry(iDep[uVar12],iVar10);
            Vec_IntPush(obs[iVar3],(int)uVar12);
            iVar5 = iVar5 + 1;
          }
        }
        pModel[uVar12] = (uint)(pModel[uVar12] == 0);
        free(piVar7);
      }
    }
    psVar8 = (saucy_graph *)malloc(0x18);
    piVar7 = ints(uVar2 + uVar1 + 1);
    piVar9 = ints(iVar5 * 2);
    psVar8->n = uVar2 + uVar1;
    psVar8->e = iVar5;
    *piVar7 = 0;
    psVar8->adj = piVar7;
    psVar8->edg = piVar9;
    iVar5 = 0;
    uVar12 = 0;
    if (0 < (int)uVar1) {
      uVar12 = (ulong)uVar1;
    }
    uVar13 = 0;
    while (uVar14 = uVar13, uVar14 != uVar12) {
      lVar15 = (long)iVar5;
      iVar5 = iVar5 + obs[uVar14]->nSize;
      piVar7[uVar14 + 1] = iVar5;
      for (lVar11 = 0; uVar13 = uVar14 + 1, lVar15 + lVar11 < (long)iVar5; lVar11 = lVar11 + 1) {
        iVar5 = Vec_IntEntry(obs[uVar14],(int)lVar11);
        piVar9[lVar15 + lVar11] = iVar5 + uVar1;
        iVar5 = piVar7[uVar14 + 1];
      }
    }
    for (uVar13 = 0; uVar13 != uVar6; uVar13 = uVar13 + 1) {
      iVar5 = piVar7[(long)(int)uVar1 + uVar13];
      iVar10 = topOrder[uVar13]->nSize + iVar5;
      piVar7[(long)(int)uVar1 + uVar13 + 1] = iVar10;
      for (lVar11 = 0; iVar5 + lVar11 < (long)iVar10; lVar11 = lVar11 + 1) {
        iVar10 = Vec_IntEntry((Vec_Int_t *)topOrder[uVar13],(int)lVar11);
        piVar9[iVar5 + lVar11] = iVar10;
        iVar10 = piVar7[(long)(int)uVar1 + uVar13 + 1];
      }
    }
    free(__ptr);
    free(pModel);
    for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
      topOrder[uVar13]->nSize = 0;
    }
    for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
      obs[uVar6]->nSize = 0;
    }
  }
  return psVar8;
}

Assistant:

static struct saucy_graph *
buildSim2Graph( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randVec, Vec_Int_t ** iDep, Vec_Int_t ** oDep, Vec_Ptr_t ** topOrder, Vec_Int_t ** obs,  Vec_Int_t ** ctrl )
{
    int i, j, k;
    struct saucy_graph *g = NULL;
    int n, e = 0, *adj, *edg;
    int * vPiValues;
    int * output, * output2;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);

    extern int * Abc_NtkSimulateOneNode( Abc_Ntk_t * , int * , int , Vec_Ptr_t ** );    
    
    vPiValues = generateProperInputVector(pNtk, c, randVec);
    if (vPiValues == NULL) 
        return NULL;

    output = Abc_NtkVerifySimulatePattern( pNtk, vPiValues );   
    
    for (i = 0; i < numins; i++) {
        if (!c->clen[c->cfront[i+numouts]]) continue;
        if (vPiValues[i] == 0)  vPiValues[i] = 1;
        else                    vPiValues[i] = 0;

        output2 = Abc_NtkSimulateOneNode( pNtk, vPiValues, i, topOrder );

        for (j = 0; j < Vec_IntSize(iDep[i]); j++) {
            if (output[Vec_IntEntry(iDep[i], j)] != output2[Vec_IntEntry(iDep[i], j)]) {
                Vec_IntPush(obs[i], Vec_IntEntry(iDep[i], j));
                Vec_IntPush(ctrl[Vec_IntEntry(iDep[i], j)], i);
                e++;
            }
        }

        if (vPiValues[i] == 0)  vPiValues[i] = 1;
        else                    vPiValues[i] = 0;

        ABC_FREE( output2 );
    }       

    /* build the graph */
    g = ABC_ALLOC(struct saucy_graph, 1);
    n = numouts + numins;
    adj = ints(n+1);
    edg = ints(2*e);        
    g->n = n;
    g->e = e;
    g->adj = adj;
    g->edg = edg;       

    adj[0] = 0;
    for (i = 0; i < numouts; i++) {
        adj[i+1] = adj[i] + Vec_IntSize(ctrl[i]);
        for (k = 0, j = adj[i]; j < adj[i+1]; j++, k++)
            edg[j] = Vec_IntEntry(ctrl[i], k) + numouts;
    }
    for (i = 0; i < numins; i++) {
        adj[i+numouts+1] = adj[i+numouts] + Vec_IntSize(obs[i]);
        for (k = 0, j = adj[i+numouts]; j < adj[i+numouts+1]; j++, k++)
            edg[j] = Vec_IntEntry(obs[i], k);
    }

    /* print graph */
    /*for (i = 0; i < n; i++) {
        printf("%d: ", i);
        for (j = adj[i]; j < adj[i+1]; j++)
            printf("%d ", edg[j]);
        printf("\n");
    }*/

    ABC_FREE( output );
    ABC_FREE( vPiValues );  
    for (j = 0; j < numins; j++)
        Vec_IntClear(obs[j]);
    for (j = 0; j < numouts; j++)
        Vec_IntClear(ctrl[j]);

    return g;
}